

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

void __thiscall AGSSockAPI::Beacon::reset(Beacon *this)

{
  ssize_t sVar1;
  undefined1 local_18 [8];
  char buffer [8];
  Beacon *this_local;
  
  buffer = (char  [8])this;
  do {
    sVar1 = read((this->data).fd[0],local_18,8);
  } while (0 < sVar1);
  return;
}

Assistant:

void Beacon::reset()
{
#if defined(_WIN32) && (IMPL_MODE == 1)
	char buffer[8];
	while (recv(data.fd, buffer, sizeof (buffer), 0) > 0);
#elif defined(_WIN32) && (IMPL_MODE == 2)
	closesocket(data.fd);
	data.fd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	setblocking(data.fd, false);
#else
	char buffer[8];
	while (read(data.fd[0], buffer, sizeof (buffer)) > 0);
#endif
}